

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

size_t uv__count_bufs(uv_buf_t *bufs,uint nbufs)

{
  size_t local_20;
  size_t bytes;
  uint i;
  uint nbufs_local;
  uv_buf_t *bufs_local;
  
  local_20 = 0;
  for (bytes._0_4_ = 0; (uint)bytes < nbufs; bytes._0_4_ = (uint)bytes + 1) {
    local_20 = bufs[(uint)bytes].len + local_20;
  }
  return local_20;
}

Assistant:

size_t uv__count_bufs(const uv_buf_t bufs[], unsigned int nbufs) {
  unsigned int i;
  size_t bytes;

  bytes = 0;
  for (i = 0; i < nbufs; i++)
    bytes += (size_t) bufs[i].len;

  return bytes;
}